

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsCurveGeometry.h
# Opt level: O0

Index __thiscall anurbs::NurbsCurveGeometry<3L>::span_at(NurbsCurveGeometry<3L> *this,double t)

{
  int iVar1;
  undefined4 extraout_var;
  Index IVar2;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_40;
  double local_18;
  double t_local;
  NurbsCurveGeometry<3L> *this_local;
  
  local_18 = t;
  t_local = (double)this;
  iVar1 = (*(this->super_CurveBase<3L>)._vptr_CurveBase[2])();
  knots(&local_40,this);
  IVar2 = Nurbs::
          upper_span<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>>>
                    (CONCAT44(extraout_var,iVar1),&local_40,&local_18);
  Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
            (&local_40);
  return IVar2;
}

Assistant:

Index span_at(const double t) const
    {
        return Nurbs::upper_span(degree(), knots(), t);
    }